

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNStmReturn::gen_code(CTPNStmReturn *this,int param_2,int param_3)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  tc_constval_type_t tVar6;
  int iVar7;
  CTcConstVal *pCVar8;
  CTPNStmEnclosing *pCVar9;
  CTPNCodeBody *pCVar10;
  CTPNStmBase *in_RDI;
  uint fin_ret_lcl;
  int did_save_retval;
  int depth;
  int need_gen;
  int val_on_stack;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  
  CTPNStmBase::add_debug_line_rec(in_RDI);
  bVar2 = true;
  bVar3 = false;
  if (in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    iVar5 = CTcGenTarg::is_in_constructor(G_cg);
    if (iVar5 != 0) {
      CTPNStmBase::log_error(in_RDI,0x2e29);
    }
    iVar5 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x287603);
    if (iVar5 != 0) {
      pCVar8 = (CTcConstVal *)
               (**(code **)(*in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase +
                           8))();
      tVar6 = CTcConstVal::get_type(pCVar8);
      bVar2 = tVar6 != TC_CVT_NIL && tVar6 != TC_CVT_TRUE;
    }
    if (bVar2) {
      iVar5 = CTcGenTarg::get_sp_depth(G_cg);
      pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      (**(code **)*pp_Var1)(pp_Var1,0);
      iVar7 = CTcGenTarg::get_sp_depth(G_cg);
      bVar3 = iVar5 < iVar7;
    }
    else {
      bVar3 = false;
    }
  }
  pCVar9 = CTcCodeStream::get_enclosing(G_cs);
  if (pCVar9 == (CTPNStmEnclosing *)0x0) goto LAB_00287754;
  if (bVar3) {
    pCVar9 = CTcCodeStream::get_enclosing(G_cs);
    iVar5 = (*(pCVar9->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x22])();
    if ((iVar5 == 0) ||
       (pCVar10 = CTcCodeStream::get_code_body(G_cs), pCVar10 == (CTPNCodeBody *)0x0))
    goto LAB_0028771d;
    pCVar10 = CTcCodeStream::get_code_body(G_cs);
    CTPNCodeBody::alloc_fin_ret_lcl(pCVar10);
    CTcSymLocal::s_gen_code_setlcl_stk(0,0x287713);
    bVar4 = true;
  }
  else {
LAB_0028771d:
    bVar4 = false;
  }
  pCVar9 = CTcCodeStream::get_enclosing(G_cs);
  (*(pCVar9->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase[0x21])();
  if (bVar4) {
    CTcSymLocal::s_gen_code_getlcl(0,0x287752);
  }
LAB_00287754:
  iVar5 = CTcGenTarg::is_in_constructor(G_cg);
  if (iVar5 == 0) {
    if (in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase == (_func_int **)0x0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    else {
      iVar5 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2877c8);
      if (iVar5 != 0) {
        pCVar8 = (CTcConstVal *)
                 (**(code **)(*in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
                             + 8))();
        tVar6 = CTcConstVal::get_type(pCVar8);
        if (tVar6 == TC_CVT_NIL) {
          CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        }
        else if (tVar6 == TC_CVT_TRUE) {
          CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        }
      }
      if (bVar2) {
        if (bVar3) {
          CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
          CTcGenTarg::note_pop((CTcGenTarg *)0x287860);
        }
        else {
          CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        }
      }
    }
  }
  else {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
  }
  return;
}

Assistant:

void CTPNStmReturn::gen_code(int, int)
{
    int val_on_stack;
    int need_gen;

    /* add a line record */
    add_debug_line_rec();

    /* presume we'll generate a value */
    need_gen = TRUE;
    val_on_stack = FALSE;

    /* generate the return value expression, if appropriate */
    if (expr_ != 0)
    {
        /* 
         *   it's an error if we're in a constructor, because a
         *   constructor implicitly always returns 'self' 
         */
        if (G_cg->is_in_constructor())
            log_error(TCERR_CONSTRUCT_CANNOT_RET_VAL);

        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
            case TC_CVT_TRUE:
                /* 
                 *   we can use special constant return instructions for
                 *   these, so there's no need to generate the value 
                 */
                need_gen = FALSE;
                break;

            default:
                /* 
                 *   other types don't have constant-return opcodes, so we
                 *   must generate the expression code 
                 */
                need_gen = TRUE;
                break;
            }
        }

        /* if necessary, generate the value */
        if (need_gen)
        {
            int depth;

            /* note the initial stack depth */
            depth = G_cg->get_sp_depth();

            /*  
             *   Generate the value.  We are obviously not discarding the
             *   value, and since returning a value is equivalent to
             *   assigning the value, we must use the stricter assignment
             *   (not 'for condition') rules for logical expressions 
             */
            expr_->gen_code(FALSE, FALSE);

            /* note whether we actually left a value on the stack */
            val_on_stack = (G_cg->get_sp_depth() > depth);
        }
        else
        {
            /* 
             *   we obviously aren't leaving a value on the stack if we
             *   don't generate anything 
             */
            val_on_stack = FALSE;
        }
    }

    /* 
     *   Before we return, let any enclosing statements generate any code
     *   necessary to leave their scope (in particular, we must invoke
     *   'finally' handlers in any enclosing 'try' blocks).
     *   
     *   Note that we generated the expression BEFORE we call any
     *   'finally' handlers.  This is necessary because something we call
     *   in the course of evaluating the return value could have thrown an
     *   exception; if we were to call the 'finally' clauses before
     *   generating the return value, we could invoke the 'finally' clause
     *   twice (once explicitly, once in the handling of the thrown
     *   exception), which would be incorrect.  By generating the
     *   'finally' calls after the return expression, we're sure that the
     *   'finally' blocks are invoked only once - either through the
     *   throw, or else now, after there's no more possibility of a
     *   'throw' before the return.  
     */
    if (G_cs->get_enclosing() != 0)
    {
        int did_save_retval;
        uint fin_ret_lcl;

        /* 
         *   if we're going to generate any subroutine calls, and we have
         *   a return value on the stack, we need to save the return value
         *   in a local to make sure the calculated value isn't affected
         *   by the subroutine call 
         */
        if (val_on_stack
            && G_cs->get_enclosing()->will_gen_code_unwind_for_return()
            && G_cs->get_code_body() != 0)
        {
            /* allocate a local variable to save the return value */
            fin_ret_lcl = G_cs->get_code_body()->alloc_fin_ret_lcl();

            /* save the return value in a stack temporary for a moment */
            CTcSymLocal::s_gen_code_setlcl_stk(fin_ret_lcl, FALSE);

            /* 
             *   note that we saved the return value, so we can retrieve
             *   it later 
             */
            did_save_retval = TRUE;
        }
        else
        {
            /* note that we didn't save the return value */
            did_save_retval = FALSE;
        }

        /* generate the unwind */
        G_cs->get_enclosing()->gen_code_unwind_for_return();

        /* if we saved the return value, retrieve it */
        if (did_save_retval)
            CTcSymLocal::s_gen_code_getlcl(fin_ret_lcl, FALSE);
    }

    /* check for an expression to return */
    if (G_cg->is_in_constructor())
    {
        /* we're in a constructor - return 'self' */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_RETVAL);
    }
    else if (expr_ == 0)
    {
        /* 
         *   there's no expression - generate a simple void return (but
         *   explicitly return nil, so we don't return something left in
         *   R0 from a previous function call we made) 
         */
        G_cg->write_op(OPC_RETNIL);
    }
    else
    {
        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
                /* generate a RETNIL instruction */
                G_cg->write_op(OPC_RETNIL);
                break;

            case TC_CVT_TRUE:
                /* generate a RETTRUE instruction */
                G_cg->write_op(OPC_RETTRUE);
                break;

            default:
                break;
            }
        }

        /* 
         *   if we needed code generation to evaluate the return value, we
         *   now need to return the value 
         */
        if (need_gen)
        {
            /* 
             *   Other types don't have constant-return opcodes.  We
             *   already generated the expression value (before invoking
             *   the enclosing 'finally' handlers, if any), so the value
             *   is on the stack, and all we need to do is return it.
             *   
             *   If we didn't actually leave a value on the stack, we'll
             *   just return nil.  
             */
            if (val_on_stack)
            {
                /* generate the return-value opcode */
                G_cg->write_op(OPC_RETVAL);
                
                /* RETVAL removes an element from the stack */
                G_cg->note_pop();
            }
            else
            {
                /* 
                 *   The depth didn't change - they must have evaluated an
                 *   expression involving a dstring or void function.
                 *   Return nil instead of the non-existent value.  
                 */
                G_cg->write_op(OPC_RETNIL);
            }
        }
    }
}